

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O1

bool __thiscall OpenMesh::TriConnectivity::is_collapse_ok(TriConnectivity *this,HalfedgeHandle v0v1)

{
  VertexHandle _vh;
  VertexHandle _vh_00;
  HalfedgeHandle HVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  value_type vVar5;
  reference pvVar6;
  Halfedge *pHVar7;
  Vertex *pVVar8;
  HalfedgeHandle _heh;
  BaseHandle local_54;
  BaseHandle local_50;
  undefined1 local_48 [8];
  VertexVertexIter vv_it;
  
  pvVar6 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_PolyConnectivity).super_ArrayKernel.edge_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (EdgeHandle)((int)v0v1.super_BaseHandle.idx_ >> 1));
  if ((pvVar6->status_ & 1) == 0) {
    _heh.super_BaseHandle.idx_ =
         (BaseHandle)
         ((-((uint)v0v1.super_BaseHandle.idx_ & 1) | 1) + (int)v0v1.super_BaseHandle.idx_);
    pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,_heh);
    _vh.super_BaseHandle.idx_ =
         (BaseHandle)(pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
    pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,v0v1);
    _vh_00.super_BaseHandle.idx_ =
         (BaseHandle)(pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
    pvVar6 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                       ((BaseKernel *)this,
                        (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->super_PolyConnectivity).super_ArrayKernel.vertex_status_.
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_,(VertexHandle)_vh.super_BaseHandle.idx_);
    if (((pvVar6->status_ & 1) == 0) &&
       (pvVar6 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                           ((BaseKernel *)this,
                            (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                            (this->super_PolyConnectivity).super_ArrayKernel.vertex_status_.
                            super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle
                            .idx_,_vh_00), (pvVar6->status_ & 1) == 0)) {
      pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,v0v1);
      local_50.idx_ = -1;
      local_54.idx_ = -1;
      if ((pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1) {
        pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,v0v1);
        HVar1.super_BaseHandle.idx_ =
             (BaseHandle)
             (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,HVar1);
        uVar2 = (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,HVar1);
        local_54.idx_ = (pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
        pHVar7 = ArrayKernel::halfedge
                           ((ArrayKernel *)this,
                            (HalfedgeHandle)
                            ((-((uint)HVar1.super_BaseHandle.idx_ & 1) | 1) +
                            (int)HVar1.super_BaseHandle.idx_));
        if (((pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1) &&
           (pHVar7 = ArrayKernel::halfedge
                               ((ArrayKernel *)this,(HalfedgeHandle)((-(uVar2 & 1) | 1) + uVar2)),
           (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1)) {
          return false;
        }
      }
      pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,_heh);
      if ((pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1) {
        pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,_heh);
        HVar1.super_BaseHandle.idx_ =
             (BaseHandle)
             (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,HVar1);
        uVar2 = (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
        pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,HVar1);
        local_50.idx_ = (pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
        pHVar7 = ArrayKernel::halfedge
                           ((ArrayKernel *)this,
                            (HalfedgeHandle)
                            ((-((uint)HVar1.super_BaseHandle.idx_ & 1) | 1) +
                            (int)HVar1.super_BaseHandle.idx_));
        if (((pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1) &&
           (pHVar7 = ArrayKernel::halfedge
                               ((ArrayKernel *)this,(HalfedgeHandle)((-(uVar2 & 1) | 1) + uVar2)),
           (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1)) {
          return false;
        }
      }
      if (local_54.idx_ != local_50.idx_) {
        local_48 = (undefined1  [8])0x0;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             (mesh_ptr)0xffffffffffffffff;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_
             = (BaseHandle)0x0;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
             (BaseHandle)0xffffffff;
        pVVar8 = ArrayKernel::vertex((ArrayKernel *)this,_vh);
        iVar4 = (pVVar8->halfedge_handle_).super_BaseHandle.idx_;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             (mesh_ptr)CONCAT44(iVar4,iVar4);
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ =
             vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ &
             0xffffffff00000000;
        local_48 = (undefined1  [8])this;
        if (iVar4 != -1) {
          do {
            if (((int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ == iVar4)
               && (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                   super_BaseHandle.idx_ != 0)) break;
            vVar5 = Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_48);
            pvVar6 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                               ((BaseKernel *)this,
                                (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->super_PolyConnectivity).super_ArrayKernel.vertex_status_.
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_,(VertexHandle)vVar5.super_BaseHandle.idx_);
            *(byte *)&pvVar6->status_ = (byte)pvVar6->status_ & 0xdf;
            Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                          *)local_48);
            iVar4 = vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_;
          } while (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1)
          ;
        }
        pVVar8 = ArrayKernel::vertex((ArrayKernel *)this,(VertexHandle)_vh_00.super_BaseHandle.idx_)
        ;
        iVar4 = (pVVar8->halfedge_handle_).super_BaseHandle.idx_;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             (mesh_ptr)CONCAT44(iVar4,iVar4);
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ =
             vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ &
             0xffffffff00000000;
        local_48 = (undefined1  [8])this;
        if (iVar4 != -1) {
          do {
            if (((int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ == iVar4)
               && (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                   super_BaseHandle.idx_ != 0)) break;
            vVar5 = Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_48);
            pvVar6 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                               ((BaseKernel *)this,
                                (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->super_PolyConnectivity).super_ArrayKernel.vertex_status_.
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_,(VertexHandle)vVar5.super_BaseHandle.idx_);
            *(byte *)&pvVar6->status_ = (byte)pvVar6->status_ | 0x20;
            Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                          *)local_48);
            iVar4 = vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_;
          } while (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1)
          ;
        }
        pVVar8 = ArrayKernel::vertex((ArrayKernel *)this,_vh);
        iVar4 = (pVVar8->halfedge_handle_).super_BaseHandle.idx_;
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             (mesh_ptr)CONCAT44(iVar4,iVar4);
        vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ =
             vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._8_8_ &
             0xffffffff00000000;
        local_48 = (undefined1  [8])this;
        if (iVar4 != -1) {
          do {
            if (((int)vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ == iVar4)
               && (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                   super_BaseHandle.idx_ != 0)) break;
            vVar5 = Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_48);
            pvVar6 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                               ((BaseKernel *)this,
                                (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                                (this->super_PolyConnectivity).super_ArrayKernel.vertex_status_.
                                super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
                                super_BaseHandle.idx_,(VertexHandle)vVar5.super_BaseHandle.idx_);
            if (((pvVar6->status_ & 0x20) != 0) &&
               ((vVar5 = Iterators::
                         GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                         ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                      *)local_48),
                vVar5.super_BaseHandle.idx_ != (BaseHandle)local_54.idx_ &&
                (vVar5 = Iterators::
                         GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                         ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                      *)local_48),
                vVar5.super_BaseHandle.idx_ != (BaseHandle)local_50.idx_)))) {
              return false;
            }
            Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                          *)local_48);
            iVar4 = vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_;
          } while (vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1)
          ;
        }
        bVar3 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,_vh);
        if ((((!bVar3) ||
             (bVar3 = PolyConnectivity::is_boundary
                                (&this->super_PolyConnectivity,
                                 (VertexHandle)_vh_00.super_BaseHandle.idx_), !bVar3)) ||
            (pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,v0v1),
            (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1)) ||
           (pHVar7 = ArrayKernel::halfedge((ArrayKernel *)this,_heh),
           (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool TriConnectivity::is_collapse_ok(HalfedgeHandle v0v1)
{
  // is the edge already deleted?
  if ( status(edge_handle(v0v1)).deleted() )
    return false;

  HalfedgeHandle  v1v0(opposite_halfedge_handle(v0v1));
  VertexHandle    v0(to_vertex_handle(v1v0));
  VertexHandle    v1(to_vertex_handle(v0v1));

  // are vertices already deleted ?
  if (status(v0).deleted() || status(v1).deleted())
    return false;

  VertexHandle    vl, vr;
  HalfedgeHandle  h1, h2;

  // the edges v1-vl and vl-v0 must not be both boundary edges
  if (!is_boundary(v0v1))
  {

    h1 = next_halfedge_handle(v0v1);
    h2 = next_halfedge_handle(h1);

    vl = to_vertex_handle(h1);

    if (is_boundary(opposite_halfedge_handle(h1)) &&
        is_boundary(opposite_halfedge_handle(h2)))
    {
      return false;
    }
  }


  // the edges v0-vr and vr-v1 must not be both boundary edges
  if (!is_boundary(v1v0))
  {

    h1 = next_halfedge_handle(v1v0);
    h2 = next_halfedge_handle(h1);

    vr = to_vertex_handle(h1);

    if (is_boundary(opposite_halfedge_handle(h1)) &&
        is_boundary(opposite_halfedge_handle(h2)))
      return false;
  }

  // if vl and vr are equal or both invalid -> fail
  if (vl == vr) return false;

  VertexVertexIter  vv_it;

  // test intersection of the one-rings of v0 and v1
  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
    status(*vv_it).set_tagged(false);

  for (vv_it = vv_iter(v1); vv_it.is_valid(); ++vv_it)
    status(*vv_it).set_tagged(true);

  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
    if (status(*vv_it).tagged() && *vv_it != vl && *vv_it != vr)
      return false;


  // edge between two boundary vertices should be a boundary edge
  if ( is_boundary(v0) && is_boundary(v1) &&
       !is_boundary(v0v1) && !is_boundary(v1v0))
    return false;

  // passed all tests
  return true;
}